

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O0

void duckdb_brotli::BrotliInitZopfliNodes(ZopfliNode *array,size_t length)

{
  ZopfliNode *pZVar1;
  size_t i;
  ZopfliNode stub;
  size_t length_local;
  ZopfliNode *array_local;
  
  for (i = 0; i < length; i = i + 1) {
    pZVar1 = array + i;
    pZVar1->length = 1;
    pZVar1->distance = 0;
    pZVar1->dcode_insert_length = 0;
    pZVar1->u = (anon_union_4_3_cc401a1e_for_u)0x7effc99e;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliInitZopfliNodes(ZopfliNode* array, size_t length) {
  ZopfliNode stub;
  size_t i;
  stub.length = 1;
  stub.distance = 0;
  stub.dcode_insert_length = 0;
  stub.u.cost = kInfinity;
  for (i = 0; i < length; ++i) array[i] = stub;
}